

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu540c.c
# Opt level: O1

MPP_RET hal_jpege_v540c_ret_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  
  pEVar1 = task->rc_task;
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) enter\n","hal_jpege_v540c_ret_task",399);
  }
  task->length = task->length + task->hw_length;
  (pEVar1->info).bit_real = task->hw_length << 3;
  (pEVar1->info).quality_real = (pEVar1->info).quality_target;
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) leave\n","hal_jpege_v540c_ret_task",0x197);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_v540c_ret_task(void *hal, HalEncTask *task)
{
    (void)hal;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    hal_jpege_enter();

    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = rc_info->quality_target;

    hal_jpege_leave();
    return MPP_OK;
}